

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O2

char * get_quoted_string(char **string,size_t *output_string_len)

{
  size_t __n;
  char cVar1;
  char *pcVar2;
  JSON_Status JVar3;
  byte *__src;
  char *pcVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  char *pcVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lStack_50;
  uint local_48;
  uint local_44;
  byte *local_40;
  size_t *local_38;
  
  pcVar4 = *string;
  pcVar2 = pcVar4;
  if (*pcVar4 == '\"') {
    do {
      while( true ) {
        pcVar8 = pcVar2;
        *string = pcVar8 + 1;
        cVar1 = pcVar8[1];
        if (cVar1 != '\\') break;
        *string = pcVar8 + 2;
        pcVar2 = pcVar8 + 2;
        if (pcVar8[2] == '\0') {
          return (char *)0x0;
        }
      }
      if (cVar1 == '\0') {
        return (char *)0x0;
      }
      pcVar2 = pcVar8 + 1;
    } while (cVar1 != '\"');
    pcVar8 = pcVar8 + 2;
    *string = pcVar8;
    local_38 = output_string_len;
    __src = (byte *)(*parson_malloc)((size_t)(pcVar8 + (-1 - (long)pcVar4)));
    if (__src != (byte *)0x0) {
      pbVar10 = (byte *)(pcVar4 + 1);
      pbVar9 = __src;
      local_40 = __src;
      while ((bVar6 = *pbVar10, bVar6 != 0 &&
             (pbVar10 + -(long)(pcVar4 + 1) < pcVar8 + (-2 - (long)pcVar4)))) {
        if (bVar6 == 0x5c) {
          pbVar11 = pbVar10 + 1;
          bVar6 = pbVar10[1];
          switch(bVar6) {
          case 0x6e:
            *pbVar9 = 10;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
            goto switchD_0014da6d_caseD_6f;
          case 0x72:
            *pbVar9 = 0xd;
            break;
          case 0x74:
            *pbVar9 = 9;
            break;
          case 0x75:
            JVar3 = parse_utf16_hex((char *)(pbVar10 + 2),&local_44);
            uVar5 = local_44;
            __src = local_40;
            if (JVar3 != 0) goto switchD_0014da6d_caseD_6f;
            bVar6 = (byte)local_44;
            if (local_44 < 0x80) {
              *pbVar9 = bVar6;
              lStack_50 = 1;
            }
            else {
              if (local_44 < 0x800) {
                *pbVar9 = (byte)(local_44 >> 6) | 0xc0;
                pbVar9[1] = bVar6 & 0x3f | 0x80;
                pbVar9 = pbVar9 + 1;
              }
              else {
                if (0xfffff7ff < local_44 - 0xe000) {
                  if ((((local_44 < 0xdc00) && (pbVar10[6] == 0x5c)) && (pbVar10[7] == 0x75)) &&
                     ((JVar3 = parse_utf16_hex((char *)(pbVar10 + 8),&local_48), __src = local_40,
                      JVar3 == 0 && (0xfffffbff < local_48 - 0xe000)))) {
                    uVar7 = (uVar5 & 0x3ff) * 0x400;
                    uVar5 = (local_48 & 0x3ff) + uVar7 + 0x10000;
                    *pbVar9 = (byte)(uVar5 >> 0x12) | 0xf0;
                    pbVar9[1] = (byte)(uVar5 >> 0xc) & 0x3f | 0x80;
                    pbVar9[2] = (byte)((local_48 & 0x3ff | uVar7) >> 6) & 0x3f | 0x80;
                    pbVar9[3] = (byte)local_48 & 0x3f | 0x80;
                    pbVar9 = pbVar9 + 3;
                    lStack_50 = 7;
                    goto LAB_0014db26;
                  }
                  goto switchD_0014da6d_caseD_6f;
                }
                *pbVar9 = (byte)(local_44 >> 0xc) & 0xf | 0xe0;
                pbVar9[1] = (byte)(local_44 >> 6) & 0x3f | 0x80;
                pbVar9[2] = bVar6 & 0x3f | 0x80;
                pbVar9 = pbVar9 + 2;
              }
              lStack_50 = 1;
            }
LAB_0014db26:
            pbVar11 = pbVar11 + lStack_50 + 3;
            __src = local_40;
            break;
          default:
            if (bVar6 == 0x66) {
              *pbVar9 = 0xc;
            }
            else if (bVar6 == 0x2f) {
              *pbVar9 = 0x2f;
            }
            else if (bVar6 == 0x5c) {
              *pbVar9 = 0x5c;
            }
            else if (bVar6 == 0x62) {
              *pbVar9 = 8;
            }
            else {
              if (bVar6 != 0x22) goto switchD_0014da6d_caseD_6f;
              *pbVar9 = 0x22;
            }
          }
        }
        else {
          if (bVar6 < 0x20) goto switchD_0014da6d_caseD_6f;
          *pbVar9 = bVar6;
          pbVar11 = pbVar10;
        }
        pbVar9 = pbVar9 + 1;
        pbVar10 = pbVar11 + 1;
      }
      *pbVar9 = 0;
      __n = ((long)pbVar9 - (long)__src) + 1;
      pcVar4 = (char *)(*parson_malloc)(__n);
      if (pcVar4 != (char *)0x0) {
        memcpy(pcVar4,__src,__n);
        *local_38 = (long)pbVar9 - (long)__src;
        (*parson_free)(__src);
        return pcVar4;
      }
    }
switchD_0014da6d_caseD_6f:
    (*parson_free)(__src);
  }
  return (char *)0x0;
}

Assistant:

static char * get_quoted_string(const char **string, size_t *output_string_len) {
    const char *string_start = *string;
    size_t input_string_len = 0;
    JSON_Status status = skip_quotes(string);
    if (status != JSONSuccess) {
        return NULL;
    }
    input_string_len = *string - string_start - 2; /* length without quotes */
    return process_string(string_start + 1, input_string_len, output_string_len);
}